

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O1

int __thiscall
FileHandlePool::getAvailableResource
          (FileHandlePool *this,fdb_file_handle **dbfile,fdb_kvs_handle **db)

{
  pointer ppPVar1;
  PoolEntry *pPVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int unaff_EBP;
  ulong uVar6;
  bool bVar7;
  
  do {
    iVar4 = rand();
    ppPVar1 = (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3;
    uVar6 = (ulong)(int)((ulong)(long)iVar4 % uVar5);
    if (uVar5 <= uVar6) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,
                 uVar5);
    }
    pPVar2 = ppPVar1[uVar6];
    bVar3 = true;
    if (pPVar2 != (PoolEntry *)0x0) {
      LOCK();
      bVar7 = (pPVar2->available)._M_base._M_i == true;
      if (bVar7) {
        (pPVar2->available)._M_base._M_i = false;
      }
      UNLOCK();
      if (bVar7) {
        *dbfile = pPVar2->dbfile;
        *db = pPVar2->db;
        unaff_EBP = pPVar2->index;
        bVar3 = false;
      }
    }
  } while (bVar3);
  return unaff_EBP;
}

Assistant:

int getAvailableResource(fdb_file_handle **dbfile, fdb_kvs_handle **db) {
        while (true) {
            int index = rand() % pool_vector.size();
            bool inverse = true;
            PoolEntry *pe = pool_vector.at(index);
            if (pe && pe->available.compare_exchange_strong(inverse, false)) {
                *dbfile = pe->dbfile;
                *db = pe->db;
                return pe->index;
            }
        }
    }